

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall TimerTest_scoped_Test::TimerTest_scoped_Test(TimerTest_scoped_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a06e8;
  return;
}

Assistant:

TEST(TimerTest, scoped) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	timer timer_obj{ period, [&iterations, &promise, &timer_obj](timer& in_timer) {
		EXPECT_EQ(timer_obj, in_timer);

		if (++iterations == total_iterations) {
			promise.set_value();
			in_timer.cancel();
		}
	} };

	EXPECT_EQ(promise.get_future().wait_for(timeout * 100000), std::future_status::ready);
}